

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_version.c
# Opt level: O0

void test_version(void)

{
  wchar_t wVar1;
  ushort **ppuVar2;
  bool bVar3;
  char *unaff_retaddr;
  void *in_stack_00000008;
  char *in_stack_00000010;
  void *in_stack_00000018;
  wchar_t in_stack_00000024;
  size_t s;
  char *q;
  char *p;
  size_t in_stack_00000040;
  int r;
  char *in_stack_00000048;
  void *in_stack_00000050;
  char *in_stack_00000468;
  wchar_t in_stack_00000474;
  char *in_stack_00000478;
  void *in_stack_ffffffffffffffb8;
  void *pvVar4;
  char *in_stack_ffffffffffffffc0;
  char *pcVar5;
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 uVar6;
  char *in_stack_ffffffffffffffd0;
  size_t local_20;
  char *local_18;
  char *local_10;
  wchar_t local_4;
  
  local_4 = systemf("%s --version >version.stdout 2>version.stderr",testprog);
  failure("Unable to run %s --version",testprog);
  wVar1 = assertion_assert(in_stack_ffffffffffffffd0,
                           (wchar_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                           (wchar_t)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                           in_stack_ffffffffffffffb8);
  if (wVar1 != L'\0') {
    assertion_empty_file(in_stack_00000478,in_stack_00000474,in_stack_00000468);
    local_18 = slurpfile(&local_20,"version.stdout");
    local_10 = local_18;
    assertion_assert(in_stack_ffffffffffffffd0,(wchar_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffb8);
    failure("Version must start with \'bsdcat\': ``%s\'\'",local_10);
    pvVar4 = (void *)0x7;
    pcVar5 = "7";
    uVar6 = 0;
    wVar1 = assertion_equal_mem((char *)s,in_stack_00000024,in_stack_00000018,in_stack_00000010,
                                in_stack_00000008,unaff_retaddr,in_stack_00000040,in_stack_00000048,
                                in_stack_00000050);
    if (wVar1 != L'\0') {
      local_18 = local_18 + 7;
      local_20 = local_20 - 7;
      while( true ) {
        bVar3 = false;
        if (((local_20 != 0) && (bVar3 = true, *local_18 != '.')) &&
           (bVar3 = false, '/' < *local_18)) {
          bVar3 = *local_18 < ':';
        }
        if (!bVar3) break;
        local_18 = local_18 + 1;
        local_20 = local_20 - 1;
      }
      failure("No space after bsdcat version: ``%s\'\'",local_10);
      assertion_assert(in_stack_ffffffffffffffd0,(wchar_t)((ulong)uVar6 >> 0x20),(wchar_t)uVar6,
                       pcVar5,pvVar4);
      if (((*local_18 == 'a') || (*local_18 == 'b')) || ((*local_18 == 'c' || (*local_18 == 'd'))))
      {
        local_18 = local_18 + 1;
      }
      failure("No space after bsdcat version: ``%s\'\'",local_10);
      assertion_assert(in_stack_ffffffffffffffd0,(wchar_t)((ulong)uVar6 >> 0x20),(wchar_t)uVar6,
                       pcVar5,pvVar4);
      local_18 = local_18 + 1;
      local_20 = local_20 - 1;
      failure("No `-\' between bsdcat and libarchive versions: ``%s\'\'",local_10);
      pvVar4 = (void *)0x2;
      pcVar5 = "2";
      uVar6 = 0;
      assertion_equal_mem((char *)s,in_stack_00000024,in_stack_00000018,in_stack_00000010,
                          in_stack_00000008,unaff_retaddr,in_stack_00000040,in_stack_00000048,
                          in_stack_00000050);
      local_18 = local_18 + 2;
      local_20 = local_20 - 2;
      failure("Not long enough for libarchive version: ``%s\'\'",local_10);
      assertion_assert(in_stack_ffffffffffffffd0,(wchar_t)((ulong)uVar6 >> 0x20),(wchar_t)uVar6,
                       pcVar5,pvVar4);
      failure("Libarchive version must start with `libarchive\': ``%s\'\'",local_10);
      pvVar4 = (void *)0xb;
      pcVar5 = "11";
      uVar6 = 0;
      assertion_equal_mem((char *)s,in_stack_00000024,in_stack_00000018,in_stack_00000010,
                          in_stack_00000008,unaff_retaddr,in_stack_00000040,in_stack_00000048,
                          in_stack_00000050);
      local_18 = local_18 + 0xb;
      local_20 = local_20 - 0xb;
      while( true ) {
        bVar3 = false;
        if (((local_20 != 0) && (bVar3 = true, *local_18 != '.')) &&
           (bVar3 = false, '/' < *local_18)) {
          bVar3 = *local_18 < ':';
        }
        if (!bVar3) break;
        local_18 = local_18 + 1;
        local_20 = local_20 - 1;
      }
      if ((((*local_18 == 'a') || (*local_18 == 'b')) || (*local_18 == 'c')) || (*local_18 == 'd'))
      {
        local_18 = local_18 + 1;
      }
      while( true ) {
        bVar3 = false;
        if (((local_20 != 0) && (bVar3 = true, *local_18 != ' ')) &&
           ((bVar3 = true, *local_18 != '/' && (bVar3 = true, *local_18 != '.')))) {
          ppuVar2 = __ctype_b_loc();
          bVar3 = ((*ppuVar2)[(int)*local_18] & 8) != 0;
        }
        if (!bVar3) break;
        local_18 = local_18 + 1;
        local_20 = local_20 - 1;
      }
      assertion_assert(in_stack_ffffffffffffffd0,(wchar_t)((ulong)uVar6 >> 0x20),(wchar_t)uVar6,
                       pcVar5,pvVar4);
      failure("Version output must end with \\n or \\r\\n");
      if (*local_18 == '\r') {
        local_18 = local_18 + 1;
        local_20 = local_20 - 1;
      }
      assertion_equal_mem((char *)s,in_stack_00000024,in_stack_00000018,in_stack_00000010,
                          in_stack_00000008,unaff_retaddr,in_stack_00000040,in_stack_00000048,
                          in_stack_00000050);
      free(local_10);
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_version)
{
	int r;
	char *p, *q;
	size_t s;


	r = systemf("%s --version >version.stdout 2>version.stderr", testprog);
	failure("Unable to run %s --version", testprog);
	if (!assert(r == 0))
		return;

	/* --version should generate nothing to stdout. */
	assertEmptyFile("version.stderr");
	/* Verify format of version message. */
	q = p = slurpfile(&s, "version.stdout");
	/* Version message should start with name of program, then space. */
	assert(s > 6);
	failure("Version must start with 'bsdcat': ``%s''", p);
	if (!assertEqualMem(q, "bsdcat ", 7))
		return;
	q += 7; s -= 7;
	/* Version number is a series of digits and periods. */
	while (s > 0 && (*q == '.' || (*q >= '0' && *q <= '9'))) {
		++q;
		--s;
	}
	/* Version number terminated by space. */
	failure("No space after bsdcat version: ``%s''", p);
	assert(s > 1);
	/* Skip a single trailing a,b,c, or d. */
	if (*q == 'a' || *q == 'b' || *q == 'c' || *q == 'd')
		++q;
	failure("No space after bsdcat version: ``%s''", p);
	assert(*q == ' ');
	++q; --s;
	/* Separator. */
	failure("No `-' between bsdcat and libarchive versions: ``%s''", p);
	assertEqualMem(q, "- ", 2);
	q += 2; s -= 2;
	/* libarchive name and version number */
	failure("Not long enough for libarchive version: ``%s''", p);
	assert(s > 11);
	failure("Libarchive version must start with `libarchive': ``%s''", p);
	assertEqualMem(q, "libarchive ", 11);
	q += 11; s -= 11;
	/* Version number is a series of digits and periods. */
	while (s > 0 && (*q == '.' || (*q >= '0' && *q <= '9'))) {
		++q;
		--s;
	}
	/* Skip a single trailing a,b,c, or d. */
	if (*q == 'a' || *q == 'b' || *q == 'c' || *q == 'd')
		++q;
	/* Skip arbitrary third-party version numbers. */
	while (s > 0 && (*q == ' ' || *q == '/' || *q == '.' || isalnum(*q))) {
		++q;
		--s;
	}
	/* All terminated by end-of-line. */
	assert(s >= 1);
	/* Skip an optional CR character (e.g., Windows) */
	failure("Version output must end with \\n or \\r\\n");
	if (*q == '\r') { ++q; --s; }
	assertEqualMem(q, "\n", 1);
	free(p);
}